

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Promise<void> kj::joinPromisesFailFast(Array<kj::Promise<void>_> *promises,SourceLocation location)

{
  size_t count;
  PromiseNode *pPVar1;
  RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *count_00;
  Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer> OVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *in_RSI;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> result;
  Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer> local_88;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_80;
  ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_78;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_50;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  count = in_RSI[1];
  local_78.ptr = _::HeapArrayDisposer::
                 allocateUninitialized<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(count);
  local_78.endPtr = local_78.ptr + count;
  local_78.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  puVar3 = (undefined8 *)*in_RSI;
  local_78.pos = local_78.ptr;
  for (puVar4 = puVar3; puVar4 != puVar3 + in_RSI[1]; puVar4 = puVar4 + 1) {
    pPVar1 = (PromiseNode *)*puVar4;
    *puVar4 = 0;
    (local_78.pos)->ptr = pPVar1;
    local_80.ptr = (PromiseNode *)0x0;
    local_78.pos = local_78.pos + 1;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_80);
    puVar3 = (undefined8 *)*in_RSI;
  }
  local_50.size_ = (long)local_78.pos - (long)local_78.ptr >> 3;
  local_50.ptr = local_78.ptr;
  local_50.disposer = local_78.disposer;
  local_78.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
  local_78.pos = (RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)0x0;
  local_78.endPtr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
  ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::dispose(&local_78);
  count_00 = (RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)in_RSI[1];
  local_78.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                 _::HeapArrayDisposer::allocate<kj::_::ExceptionOr<kj::_::Void>>((size_t)count_00);
  local_78.endPtr =
       (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_::HeapArrayDisposer::instance;
  local_80.ptr._0_4_ = 1;
  local_78.pos = count_00;
  _::PromiseDisposer::
  alloc<kj::_::ArrayJoinPromiseNode<void>,kj::_::PromiseDisposer,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((PromiseDisposer *)&local_88,&local_50,
             (Array<kj::_::ExceptionOr<kj::_::Void>_> *)&local_78,&location,
             (ArrayJoinBehavior *)&local_80);
  OVar2.ptr = local_88.ptr;
  local_88.ptr = (ArrayJoinPromiseNode<void> *)0x0;
  promises->ptr = (Promise<void> *)OVar2.ptr;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer>::dispose(&local_88);
  Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array
            ((Array<kj::_::ExceptionOr<kj::_::Void>_> *)&local_78);
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array(&local_50);
  return (PromiseBase)(PromiseBase)promises;
}

Assistant:

Promise<void> joinPromisesFailFast(Array<Promise<void>>&& promises, SourceLocation location) {
  return _::PromiseNode::to<Promise<void>>(_::allocPromise<_::ArrayJoinPromiseNode<void>>(
      KJ_MAP(p, promises) { return _::PromiseNode::from(kj::mv(p)); },
      heapArray<_::ExceptionOr<_::Void>>(promises.size()), location,
      _::ArrayJoinBehavior::EAGER));
}